

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O2

PassToken __thiscall spvtools::CreateModifyMaximalReconvergencePass(spvtools *this,bool add)

{
  long *plVar1;
  undefined8 *puVar2;
  bool add_local;
  long *local_20;
  __uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  local_18;
  
  add_local = add;
  MakeUnique<spvtools::opt::ModifyMaximalReconvergence,bool&>((spvtools *)&local_20,&add_local);
  puVar2 = (undefined8 *)::operator_new(8);
  plVar1 = local_20;
  local_20 = (long *)0x0;
  *puVar2 = plVar1;
  *(undefined8 **)this = puVar2;
  local_18._M_t.
  super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl =
       (tuple<spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
        )(_Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
          )0x0;
  std::
  unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  ::~unique_ptr((unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
                 *)&local_18);
  if (local_20 != (long *)0x0) {
    (**(code **)(*local_20 + 8))();
  }
  return (unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
          )(unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
            )this;
}

Assistant:

Optimizer::PassToken CreateModifyMaximalReconvergencePass(bool add) {
  return MakeUnique<Optimizer::PassToken::Impl>(
      MakeUnique<opt::ModifyMaximalReconvergence>(add));
}